

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dchMan.c
# Opt level: O0

Dch_Man_t * Dch_ManCreate(Aig_Man_t *pAig,Dch_Pars_t *pPars)

{
  int iVar1;
  Dch_Man_t *__s;
  int *piVar2;
  Vec_Ptr_t *pVVar3;
  Aig_Obj_t **ppAVar4;
  Dch_Man_t *p;
  Dch_Pars_t *pPars_local;
  Aig_Man_t *pAig_local;
  
  __s = (Dch_Man_t *)malloc(0xe0);
  memset(__s,0,0xe0);
  __s->pPars = pPars;
  __s->pAigTotal = pAig;
  Aig_ManFanoutStart(__s->pAigTotal);
  __s->nSatVars = 1;
  iVar1 = Aig_ManObjNumMax(__s->pAigTotal);
  piVar2 = (int *)calloc((long)iVar1,4);
  __s->pSatVars = piVar2;
  pVVar3 = Vec_PtrAlloc(1000);
  __s->vUsedNodes = pVVar3;
  pVVar3 = Vec_PtrAlloc(100);
  __s->vFanins = pVVar3;
  pVVar3 = Vec_PtrAlloc(1000);
  __s->vSimRoots = pVVar3;
  pVVar3 = Vec_PtrAlloc(1000);
  __s->vSimClasses = pVVar3;
  iVar1 = Aig_ManObjNumMax(__s->pAigTotal);
  ppAVar4 = (Aig_Obj_t **)calloc((long)iVar1,8);
  __s->pReprsProved = ppAVar4;
  return __s;
}

Assistant:

ABC_NAMESPACE_IMPL_START


////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    [Creates the manager.]

  Description []
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
Dch_Man_t * Dch_ManCreate( Aig_Man_t * pAig, Dch_Pars_t * pPars )
{
    Dch_Man_t * p;
    // create interpolation manager
    p = ABC_ALLOC( Dch_Man_t, 1 );
    memset( p, 0, sizeof(Dch_Man_t) );
    p->pPars        = pPars;
    p->pAigTotal    = pAig; //Dch_DeriveTotalAig( vAigs );
    Aig_ManFanoutStart( p->pAigTotal );
    // SAT solving
    p->nSatVars     = 1;
    p->pSatVars     = ABC_CALLOC( int, Aig_ManObjNumMax(p->pAigTotal) );
    p->vUsedNodes   = Vec_PtrAlloc( 1000 );
    p->vFanins      = Vec_PtrAlloc( 100 );
    p->vSimRoots    = Vec_PtrAlloc( 1000 );
    p->vSimClasses  = Vec_PtrAlloc( 1000 );
    // equivalences proved
    p->pReprsProved = ABC_CALLOC( Aig_Obj_t *, Aig_ManObjNumMax(p->pAigTotal) );
    return p;
}